

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::GetSegmentList(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 *this,PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment)

{
  SecondaryAllocator *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *pDVar8;
  
  iVar4 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar4 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x5e5,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  uVar5 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAvailablePageCount(segment);
  if (uVar5 != segment->decommitPageCount) {
    if ((segment->decommitPageCount == 0 && segment->freePageCount == 0) ||
       ((pSVar1 = (segment->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                  secondaryAllocator, pSVar1 != (SecondaryAllocator *)0x0 &&
        (iVar4 = (*pSVar1->_vptr_SecondaryAllocator[3])(), (char)iVar4 == '\0')))) {
      pDVar8 = &this->fullSegments;
    }
    else if (segment->decommitPageCount == 0) {
      uVar5 = segment->freePageCount;
      uVar6 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAvailablePageCount
                        (segment);
      pDVar8 = &this->emptySegments;
      if (uVar5 != uVar6) {
        pDVar8 = &this->segments;
      }
    }
    else {
      pDVar8 = &this->decommitSegments;
    }
    return pDVar8;
  }
  return (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
         0x0;
}

Assistant:

DListBase<TPageSegment> *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::GetSegmentList(TPageSegment * segment)
{
    Assert(!this->HasMultiThreadAccess());

    return
        (segment->IsAllDecommitted()) ? nullptr :
        (segment->IsFull()) ? &fullSegments :
        (segment->ShouldBeInDecommittedList()) ? &decommitSegments :
        (segment->IsEmpty()) ? &emptySegments :
        &segments;
}